

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O0

_Bool bitset_container_intersect(bitset_container_t *src_1,bitset_container_t *src_2)

{
  int i;
  uint64_t *words_2;
  uint64_t *words_1;
  bitset_container_t *src_2_local;
  bitset_container_t *src_1_local;
  
  i = 0;
  while( true ) {
    if (0x3ff < i) {
      return false;
    }
    if ((src_1->words[i] & src_2->words[i]) != 0) break;
    i = i + 1;
  }
  return true;
}

Assistant:

bool bitset_container_intersect(const bitset_container_t *src_1,
                                const bitset_container_t *src_2) {
    // could vectorize, but this is probably already quite fast in practice
    const uint64_t *__restrict__ words_1 = src_1->words;
    const uint64_t *__restrict__ words_2 = src_2->words;
    for (int i = 0; i < BITSET_CONTAINER_SIZE_IN_WORDS; i++) {
        if ((words_1[i] & words_2[i]) != 0) return true;
    }
    return false;
}